

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * mi_arena_try_alloc_at
                 (mi_arena_t *arena,size_t arena_index,size_t needed_bcount,_Bool commit,
                 mi_memid_t *memid)

{
  mi_arena_id_t mVar1;
  mi_bitmap_t bitmap;
  ulong uVar2;
  _Bool _Var3;
  undefined7 in_register_00000009;
  ulong *puVar4;
  uint8_t *puVar5;
  _Bool commit_zero;
  _Bool any_uncommitted;
  mi_bitmap_index_t bitmap_index;
  size_t already_committed;
  _Bool local_42;
  _Bool local_41;
  ulong local_40;
  size_t local_38;
  
  puVar4 = (ulong *)CONCAT71(in_register_00000009,commit);
  puVar5 = (uint8_t *)0x0;
  _Var3 = _mi_bitmap_try_find_from_claim_across
                    (arena->blocks_inuse,arena->field_count,0,arena_index,&local_40);
  uVar2 = local_40;
  if (_Var3) {
    arena->search_idx = local_40 >> 6;
    puVar5 = arena->start;
    mVar1 = arena->id;
    _Var3 = arena->exclusive;
    *puVar4 = local_40;
    *(mi_arena_id_t *)(puVar4 + 1) = mVar1;
    *(_Bool *)((long)puVar4 + 0xc) = _Var3;
    puVar4[2] = 0x600000000;
    *(undefined4 *)((long)puVar4 + 0xd) = 0;
    *(_Bool *)(puVar4 + 2) = (arena->memid).is_pinned;
    if (arena->blocks_purge != (mi_bitmap_t)0x0) {
      _mi_bitmap_unclaim_across(arena->blocks_purge,arena->field_count,arena_index,local_40);
    }
    if (((arena->memid).initially_zero == true) && (arena->blocks_dirty != (mi_bitmap_t)0x0)) {
      _Var3 = _mi_bitmap_claim_across
                        (arena->blocks_dirty,arena->field_count,arena_index,local_40,(_Bool *)0x0,
                         (size_t *)0x0);
      *(_Bool *)((long)puVar4 + 0x12) = _Var3;
    }
    puVar5 = puVar5 + uVar2 * 0x2000000;
    bitmap = arena->blocks_committed;
    if (bitmap == (mi_bitmap_t)0x0) {
      *(undefined1 *)((long)puVar4 + 0x11) = 1;
    }
    else if ((char)needed_bcount == '\0') {
      local_38 = 0;
      _Var3 = _mi_bitmap_is_claimed_across(bitmap,arena->field_count,arena_index,local_40,&local_38)
      ;
      *(_Bool *)((long)puVar4 + 0x11) = _Var3;
      if (local_38 != 0 && !_Var3) {
        _mi_stat_decrease(&_mi_stats_main.committed,local_38 << 0x19);
        _mi_bitmap_unclaim_across(arena->blocks_committed,arena->field_count,arena_index,local_40);
      }
    }
    else {
      *(undefined1 *)((long)puVar4 + 0x11) = 1;
      local_38 = 0;
      _mi_bitmap_claim_across(bitmap,arena->field_count,arena_index,local_40,&local_41,&local_38);
      if (local_41 == true) {
        local_42 = false;
        _Var3 = _mi_os_commit_ex(puVar5,arena_index << 0x19,&local_42,
                                 (arena_index - local_38) * 0x2000000);
        if (_Var3) {
          if (local_42 == true) {
            *(undefined1 *)((long)puVar4 + 0x12) = 1;
          }
        }
        else {
          *(undefined1 *)((long)puVar4 + 0x11) = 0;
        }
      }
    }
  }
  return puVar5;
}

Assistant:

static mi_decl_noinline void* mi_arena_try_alloc_at(mi_arena_t* arena, size_t arena_index, size_t needed_bcount,
                                                    bool commit, mi_memid_t* memid)
{
  MI_UNUSED(arena_index);
  mi_assert_internal(mi_arena_id_index(arena->id) == arena_index);

  mi_bitmap_index_t bitmap_index;
  if (!mi_arena_try_claim(arena, needed_bcount, &bitmap_index)) return NULL;

  // claimed it!
  void* p = mi_arena_block_start(arena, bitmap_index);
  *memid = mi_memid_create_arena(arena->id, arena->exclusive, bitmap_index);
  memid->is_pinned = arena->memid.is_pinned;

  // none of the claimed blocks should be scheduled for a decommit
  if (arena->blocks_purge != NULL) {
    // this is thread safe as a potential purge only decommits parts that are not yet claimed as used (in `blocks_inuse`).
    _mi_bitmap_unclaim_across(arena->blocks_purge, arena->field_count, needed_bcount, bitmap_index);
  }

  // set the dirty bits (todo: no need for an atomic op here?)
  if (arena->memid.initially_zero && arena->blocks_dirty != NULL) {
    memid->initially_zero = _mi_bitmap_claim_across(arena->blocks_dirty, arena->field_count, needed_bcount, bitmap_index, NULL, NULL);
  }

  // set commit state
  if (arena->blocks_committed == NULL) {
    // always committed
    memid->initially_committed = true;
  }
  else if (commit) {
    // commit requested, but the range may not be committed as a whole: ensure it is committed now
    memid->initially_committed = true;
    bool any_uncommitted;
    size_t already_committed = 0;
    _mi_bitmap_claim_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index, &any_uncommitted, &already_committed);
    if (any_uncommitted) {
      mi_assert_internal(already_committed < needed_bcount);
      const size_t commit_size = mi_arena_block_size(needed_bcount);
      const size_t stat_commit_size = commit_size - mi_arena_block_size(already_committed);
      bool commit_zero = false;
      if (!_mi_os_commit_ex(p, commit_size, &commit_zero, stat_commit_size)) {
        memid->initially_committed = false;
      }
      else {
        if (commit_zero) { memid->initially_zero = true; }
      }
    }
  }
  else {
    // no need to commit, but check if already fully committed
    size_t already_committed = 0;
    memid->initially_committed = _mi_bitmap_is_claimed_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index, &already_committed);
    if (!memid->initially_committed && already_committed > 0) {
      // partially committed: as it will be committed at some time, adjust the stats and pretend the range is fully uncommitted.
      mi_assert_internal(already_committed < needed_bcount);
      _mi_stat_decrease(&_mi_stats_main.committed, mi_arena_block_size(already_committed));
      _mi_bitmap_unclaim_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index);
    }
  }

  return p;
}